

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.h
# Opt level: O3

bool Utilities::parseNumber<double>(string *s,double *x)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  char cVar5;
  bool bVar6;
  double dVar7;
  double dVar8;
  long local_1a0;
  stringstream ss;
  byte abStack_180 [96];
  ios_base local_120 [264];
  
  pcVar2 = (s->_M_dataplus)._M_p;
  cVar1 = *pcVar2;
  pcVar3 = pcVar2 + (cVar1 == '-');
  dVar7 = 0.0;
  cVar5 = pcVar2[cVar1 == '-'];
  while ((byte)(cVar5 - 0x30U) < 10) {
    dVar7 = dVar7 * 10.0 + (double)(int)(char)(cVar5 + -0x30);
    pcVar2 = pcVar3 + 1;
    pcVar3 = pcVar3 + 1;
    cVar5 = *pcVar2;
  }
  if (cVar5 == '.') {
    cVar5 = pcVar3[1];
    pcVar3 = pcVar3 + 1;
    dVar8 = 0.0;
    if ((byte)(cVar5 - 0x30U) < 10) {
      iVar4 = 1;
      do {
        dVar8 = dVar8 * 10.0 + (double)(int)(char)(cVar5 + -0x30);
        cVar5 = pcVar3[1];
        pcVar3 = pcVar3 + 1;
        iVar4 = iVar4 + 1;
      } while ((byte)(cVar5 - 0x30U) < 10);
      do {
        dVar8 = dVar8 / 10.0;
        iVar4 = iVar4 + -1;
      } while (1 < iVar4);
    }
    dVar7 = dVar7 + dVar8;
  }
  if (cVar1 == '-') {
    dVar7 = -dVar7;
  }
  *x = dVar7;
  if (*pcVar3 == '\0') {
    bVar6 = true;
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1a0,(string *)s,_S_out|_S_in);
    std::istream::_M_extract<double>((double *)&local_1a0);
    bVar6 = (abStack_180[*(long *)(local_1a0 + -0x18)] & 5) == 0;
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_1a0);
    std::ios_base::~ios_base(local_120);
  }
  return bVar6;
}

Assistant:

static bool parseNumber(const std::string& s, T &x)
    {
        const char* p = s.c_str();
        T r = 0.0;
        bool neg = false;
        if (*p == '-') {
            neg = true;
            ++p;
        }
        while (*p >= '0' && *p <= '9') {
            r = (r*10.0) + (*p - '0');
            ++p;
        }
        if (*p == '.') {
            T f = 0.0;
            int n = 0;
            ++p;
            while (*p >= '0' && *p <= '9') {
                f = (f*10.0) + (*p - '0');
                ++p;
                ++n;
            }

            while (n > 0)
            {
                f = f / 10.0;
                n--;
            }

            r += f;
        }
        if (neg) {
            r = -r;
        }

        x = r;

        if (*p == '\0')
            return true;

        // for some numbers in scientific notation 
        std::stringstream ss(s);
        ss >> x;
        return !ss.fail();
    }